

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Permission s)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 1) {
    pcVar2 = "private";
    paVar1 = &local_a;
  }
  else if ((int)this == 0) {
    pcVar2 = "public";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "[[PermissionInvalid]]";
    paVar1 = &local_b;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Permission s) {
  if (s == tinyusdz::Permission::Public) {
    return "public";
  } else if (s == tinyusdz::Permission::Private) {
    return "private";
  } else {
    return "[[PermissionInvalid]]";
  }
}